

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O0

int If_ManNodeShapeMap2_rec(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited,Vec_Int_t *vShape)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  If_Cut_t *pCut_00;
  uint local_5c;
  int iBest;
  int iFunc1;
  int iFunc0;
  int iFunc;
  int i;
  If_Obj_t *pTempBest;
  If_Obj_t *pTemp;
  If_Cut_t *pCut;
  Vec_Int_t *vShape_local;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  
  _iFunc = (If_Obj_t *)0x0;
  local_5c = 0;
  pCut_00 = If_ObjCutBest(pIfObj);
  iVar1 = If_CutDataInt(pCut_00);
  if (iVar1 == 0) {
    Vec_PtrPush(vVisited,pCut_00);
    If_CutSetDataInt(pCut_00,-1);
    iVar1 = If_ObjIsCi(pIfObj);
    pTempBest = pIfObj;
    if (iVar1 == 0) {
      for (; pTempBest != (If_Obj_t *)0x0; pTempBest = pTempBest->pEquiv) {
        uVar2 = If_ManNodeShapeMap2_rec(pIfMan,pTempBest->pFanin0,vVisited,vShape);
        if (((uVar2 != 0xffffffff) &&
            (uVar3 = If_ManNodeShapeMap2_rec(pIfMan,pTempBest->pFanin1,vVisited,vShape),
            uVar3 != 0xffffffff)) && ((int)local_5c < (int)(uVar2 | uVar3))) {
          _iFunc = pTempBest;
          local_5c = uVar2 | uVar3;
        }
      }
      if (_iFunc != (If_Obj_t *)0x0) {
        Vec_IntPush(vShape,pIfObj->Id);
        Vec_IntPush(vShape,_iFunc->Id);
        If_CutSetDataInt(pCut_00,local_5c);
      }
      pIfMan_local._4_4_ = If_CutDataInt(pCut_00);
    }
    else {
      pIfMan_local._4_4_ = If_CutDataInt(pCut_00);
    }
  }
  else {
    pIfMan_local._4_4_ = If_CutDataInt(pCut_00);
  }
  return pIfMan_local._4_4_;
}

Assistant:

int If_ManNodeShapeMap2_rec( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited, Vec_Int_t * vShape )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp, * pTempBest = NULL;
    int i, iFunc, iFunc0, iFunc1, iBest = 0;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutDataInt(pCut) )
        return If_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return If_CutDataInt(pCut);
    // compute the functions of the children
    for ( i = 0, pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv, i++ )
    {
        iFunc0 = If_ManNodeShapeMap2_rec( pIfMan, pTemp->pFanin0, vVisited, vShape );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = If_ManNodeShapeMap2_rec( pIfMan, pTemp->pFanin1, vVisited, vShape );
        if ( iFunc1 == ~0 )
            continue;
        iFunc = iFunc0 | iFunc1;
//        if ( If_WordCountOnes(iBest) <= If_WordCountOnes(iFunc) )
        if ( iBest < iFunc )
        {
            iBest = iFunc;
            pTempBest = pTemp;
        }
    }
    if ( pTempBest )
    {
        Vec_IntPush( vShape, pIfObj->Id );
        Vec_IntPush( vShape, pTempBest->Id );
        If_CutSetDataInt( pCut, iBest );
    }
    return If_CutDataInt(pCut);
}